

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.h
# Opt level: O0

void __thiscall DSDcc::DSDDstar::DStarHeader::setRpt2(DStarHeader *this,char *rpt2,bool fromHD)

{
  byte in_DL;
  char *in_RSI;
  long in_RDI;
  allocator local_39;
  string local_38 [39];
  byte local_11;
  
  local_11 = in_DL & 1;
  if (((*(byte *)(in_RDI + 0x81) & 1) == 0) || (local_11 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,in_RSI,8,&local_39);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x20),local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    *(byte *)(in_RDI + 0x81) = local_11 & 1;
  }
  return;
}

Assistant:

void setRpt2(const char *rpt2, bool fromHD)
       {
           if (!m_rpt2FromHD || fromHD)
           {
               m_rpt2 = std::string(rpt2, 8);
               m_rpt2FromHD = fromHD;
           }
       }